

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

void __thiscall
kj::_::WeakFulfiller<capnproto_test::capnp::test::TestStreaming::Client>::detach
          (WeakFulfiller<capnproto_test::capnp::test::TestStreaming::Client> *this,
          PromiseFulfiller<capnproto_test::capnp::test::TestStreaming::Client> *from)

{
  PromiseFulfiller<capnproto_test::capnp::test::TestStreaming::Client> *pPVar1;
  PromiseFulfiller<capnproto_test::capnp::test::TestStreaming::Client> *from_local;
  WeakFulfiller<capnproto_test::capnp::test::TestStreaming::Client> *this_local;
  
  pPVar1 = WeakFulfillerBase::getInner<capnproto_test::capnp::test::TestStreaming::Client>
                     (&this->super_WeakFulfillerBase);
  if (pPVar1 == (PromiseFulfiller<capnproto_test::capnp::test::TestStreaming::Client> *)0x0) {
    if (this != (WeakFulfiller<capnproto_test::capnp::test::TestStreaming::Client> *)0x0) {
      ~WeakFulfiller(this);
      operator_delete(this,0x18);
    }
  }
  else {
    pPVar1 = WeakFulfillerBase::getInner<capnproto_test::capnp::test::TestStreaming::Client>
                       (&this->super_WeakFulfillerBase);
    if (pPVar1 != from) {
      inlineRequireFailure
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-inl.h"
                 ,0x6d8,"getInner<T>() == &from","",(char *)0x0);
    }
    WeakFulfillerBase::setInner<capnproto_test::capnp::test::TestStreaming::Client>
              (&this->super_WeakFulfillerBase,
               (PromiseFulfiller<capnproto_test::capnp::test::TestStreaming::Client> *)0x0);
  }
  return;
}

Assistant:

void detach(PromiseFulfiller<T>& from) {
    if (getInner<T>() == nullptr) {
      // Already disposed.
      delete this;
    } else {
      KJ_IREQUIRE(getInner<T>() == &from);
      setInner<T>(nullptr);
    }
  }